

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2BigCountedRepetition(void)

{
  bool bVar1;
  string s;
  Options local_280;
  LogMessageFatal local_268;
  RE2 re;
  
  local_280.encoding_ = EncodingUTF8;
  local_280.posix_syntax_ = false;
  local_280.longest_match_ = false;
  local_280.log_errors_ = true;
  local_280.literal_ = false;
  local_280.never_nl_ = false;
  local_280.dot_nl_ = false;
  local_280.never_capture_ = false;
  local_280.case_sensitive_ = true;
  local_280.perl_classes_ = false;
  local_280.word_boundary_ = false;
  local_280.one_line_ = false;
  local_280.max_mem_ = 0x10000000;
  local_268.super_LogMessage._0_8_ = ".{512}x";
  local_268.super_LogMessage._8_4_ = 7;
  RE2::RE2(&re,(StringPiece *)&local_268,&local_280);
  if (re.error_code_ != NoError) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4b3);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((ulong)&s,'\x03');
  std::__cxx11::string::append((char *)&s);
  local_268.super_LogMessage._0_8_ = s._M_dataplus._M_p;
  local_268.super_LogMessage._8_4_ = (int)s._M_string_length;
  bVar1 = RE2::PartialMatch<>((StringPiece *)&local_268,&re);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4b7);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(s, re)");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  std::__cxx11::string::~string((string *)&s);
  RE2::~RE2(&re);
  return;
}

Assistant:

TEST(RE2, BigCountedRepetition) {
  // Test that counted repetition works, given tons of memory.
  RE2::Options opt;
  opt.set_max_mem(256<<20);

  RE2 re(".{512}x", opt);
  CHECK(re.ok());
  string s;
  s.append(515, 'c');
  s.append("x");
  CHECK(RE2::PartialMatch(s, re));
}